

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O2

_Bool al_register_sample_saver(char *ext,_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *saver)

{
  _Bool _Var1;
  size_t sVar2;
  ACODEC_TABLE *pAVar3;
  
  sVar2 = strlen(ext);
  if (sVar2 - 0x1f < 0xffffffffffffffe0) {
LAB_001070fb:
    _Var1 = false;
  }
  else {
    pAVar3 = find_acodec_table_entry(ext);
    if (saver == (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0) {
      if ((pAVar3 == (ACODEC_TABLE *)0x0) ||
         (pAVar3->saver == (_func__Bool_char_ptr_ALLEGRO_SAMPLE_ptr *)0x0)) goto LAB_001070fb;
    }
    else if (pAVar3 == (ACODEC_TABLE *)0x0) {
      pAVar3 = add_acodec_table_entry(ext);
    }
    pAVar3->saver = saver;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool al_register_sample_saver(const char *ext,
   bool (*saver)(const char *filename, ALLEGRO_SAMPLE *spl))
{
   ACODEC_TABLE *ent;

   if (strlen(ext) + 1 >= MAX_EXTENSION_LENGTH) {
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (!saver) {
      if (!ent || !ent->saver) {
         return false; /* Nothing to remove. */
      }
   }
   else if (!ent) {
      ent = add_acodec_table_entry(ext);
   }

   ent->saver = saver;

   return true;
}